

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void HalfMergeUVPlane(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,
                     uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_int_uint8_t_ptr_int_uint8_t_ptr_int *HalfMergeUVRow;
  int y;
  code *local_38;
  int local_30;
  long local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_38 = HalfMergeUVRow_C;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((int)(uint)dst_uv < 0) {
    dst_uv._0_4_ = -(uint)dst_uv;
    local_8 = in_RDI + (int)(((uint)dst_uv - 1) * in_ESI);
    local_18 = in_RDX + (int)(((uint)dst_uv - 1) * in_ECX);
    local_c = -in_ESI;
    local_1c = -in_ECX;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && ((y & 0xfU) == 0)) {
    local_38 = HalfMergeUVRow_SSSE3;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && ((y & 0x1fU) == 0)) {
    local_38 = HalfMergeUVRow_AVX2;
  }
  local_28 = in_R8;
  for (local_30 = 0; local_30 < (int)((uint)dst_uv - 1); local_30 = local_30 + 2) {
    (*local_38)(local_8,local_c,local_18,local_1c,local_28,y);
    local_8 = local_8 + (local_c << 1);
    local_18 = local_18 + (local_1c << 1);
    local_28 = local_28 + in_R9D;
  }
  if (((uint)dst_uv & 1) != 0) {
    (*local_38)(local_8,0,local_18,0,local_28,y);
  }
  return;
}

Assistant:

LIBYUV_API
void HalfMergeUVPlane(const uint8_t* src_u,
                      int src_stride_u,
                      const uint8_t* src_v,
                      int src_stride_v,
                      uint8_t* dst_uv,
                      int dst_stride_uv,
                      int width,
                      int height) {
  int y;
  void (*HalfMergeUVRow)(const uint8_t* src_u, int src_stride_u,
                         const uint8_t* src_v, int src_stride_v,
                         uint8_t* dst_uv, int width) = HalfMergeUVRow_C;

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_u = src_u + (height - 1) * src_stride_u;
    src_v = src_v + (height - 1) * src_stride_v;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }
#if defined(HAS_HALFMERGEUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 16)) {
    HalfMergeUVRow = HalfMergeUVRow_NEON;
  }
#endif
#if defined(HAS_HALFMERGEUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 16)) {
    HalfMergeUVRow = HalfMergeUVRow_SSSE3;
  }
#endif
#if defined(HAS_HALFMERGEUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2) && IS_ALIGNED(width, 32)) {
    HalfMergeUVRow = HalfMergeUVRow_AVX2;
  }
#endif
  for (y = 0; y < height - 1; y += 2) {
    // Merge a row of U and V into a row of UV.
    HalfMergeUVRow(src_u, src_stride_u, src_v, src_stride_v, dst_uv, width);
    src_u += src_stride_u * 2;
    src_v += src_stride_v * 2;
    dst_uv += dst_stride_uv;
  }
  if (height & 1) {
    HalfMergeUVRow(src_u, 0, src_v, 0, dst_uv, width);
  }
}